

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O1

void upd7759_reset(void *info)

{
  upd7759_state *chip;
  
  *(undefined4 *)((long)info + 0xc) = 0;
  *(undefined1 *)((long)info + 0x14) = 0;
  *(undefined1 *)((long)info + 0x17) = 0;
  *(undefined1 *)((long)info + 0x20) = 0;
  *(undefined2 *)((long)info + 0x62) = 0;
  *(undefined2 *)((long)info + 0xa2) = 0;
  *(undefined8 *)((long)info + 0x24) = 0;
  *(undefined8 *)((long)info + 0x2c) = 0;
  *(undefined1 *)((long)info + 0x34) = 0;
  *(undefined4 *)((long)info + 0x40) = 0;
  *(undefined8 *)((long)info + 0x38) = 0;
  if (*(char *)((long)info + 0x60) != '\0') {
    *(undefined4 *)((long)info + 0x24) = 0xffffffff;
  }
  return;
}

Assistant:

static void upd7759_reset(void *info)
{
	upd7759_state *chip = (upd7759_state *)info;

	chip->pos                = 0;
	chip->fifo_in            = 0;
	chip->drq                = 0;
	chip->state              = STATE_IDLE;
	chip->clocks_left        = 0;
	chip->nibbles_left       = 0;
	chip->repeat_count       = 0;
	chip->post_drq_state     = STATE_IDLE;
	chip->post_drq_clocks    = 0;
	chip->req_sample         = 0;
	chip->last_sample        = 0;
	chip->block_header       = 0;
	chip->sample_rate        = 0;
	chip->first_valid_header = 0;
	chip->offset             = 0;
	chip->repeat_offset      = 0;
	chip->adpcm_state        = 0;
	chip->adpcm_data         = 0;
	chip->sample             = 0;

	// Valley Bell: reset buffer
	chip->data_buf[0] = chip->data_buf[1] = 0x00;
	chip->dbuf_pos_read = 0x00;
	chip->dbuf_pos_write = 0x00;

	/* turn off any timer */
	//if (chip->timer)
	//	chip->timer->adjust(attotime::never);
	if (chip->ChipMode)
		chip->clocks_left = -1;
}